

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O2

void __thiscall
websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::init_asio
          (endpoint<websocketpp::config::asio::transport_config> *this)

{
  __uniq_ptr_data<asio::io_context,_std::default_delete<asio::io_context>,_true,_true> this_00;
  unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> service;
  
  this_00.super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
  super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl =
       (__uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>)operator_new(0x10)
  ;
  ::asio::io_context::io_context
            ((io_context *)
             this_00.super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>
             ._M_t.
             super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
             super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl);
  service._M_t.super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
  super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl =
       (__uniq_ptr_data<asio::io_context,_std::default_delete<asio::io_context>,_true,_true>)
       (__uniq_ptr_data<asio::io_context,_std::default_delete<asio::io_context>,_true,_true>)
       this_00.super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
       super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
       super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl;
  init_asio(this,(io_service_ptr)
                 this_00.
                 super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
                 super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl);
  service._M_t.super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
  super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
  super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl =
       (__uniq_ptr_data<asio::io_context,_std::default_delete<asio::io_context>,_true,_true>)
       (__uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>)0x0;
  this->m_external_io_service = false;
  std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::~unique_ptr(&service);
  return;
}

Assistant:

void init_asio() {
        // Use a smart pointer until the call is successful and ownership has 
        // successfully been taken. Use unique_ptr when available.
        // TODO: remove the use of auto_ptr when C++98/03 support is no longer
        //       necessary.
#ifdef _WEBSOCKETPP_CPP11_MEMORY_
        lib::unique_ptr<lib::asio::io_service> service(new lib::asio::io_service());
#else
        lib::auto_ptr<lib::asio::io_service> service(new lib::asio::io_service());
#endif
        init_asio( service.get() );
        // If control got this far without an exception, then ownership has successfully been taken
        service.release();
        m_external_io_service = false;
    }